

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O3

bool __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  node_vec_type *this_00;
  vector<unsigned_int> *this_01;
  vector<unsigned_int> *this_02;
  vector<unsigned_int> *this_03;
  uint *puVar1;
  float fVar2;
  uint uVar3;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar4;
  void *p;
  uint *puVar5;
  vec<6U,_float> *pvVar6;
  undefined8 uVar7;
  float fVar8;
  bool bVar9;
  uint i_1;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint uVar16;
  vq_node *pvVar17;
  float fVar18;
  float fVar19;
  vq_node root;
  vec<6U,_float> result;
  float local_98 [6];
  ulong uStack_80;
  float local_78;
  vector<unsigned_int> local_70;
  undefined5 local_60;
  undefined3 uStack_5b;
  undefined4 local_58;
  undefined1 local_54;
  void *local_50;
  float afStack_48 [6];
  
  uVar3 = (this->m_training_vecs).m_size;
  if (uVar3 == 0) {
    return false;
  }
  this->m_quick = quick;
  local_70.m_p = (uint *)0x0;
  local_70.m_size = 0;
  local_70.m_capacity = 0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  uStack_80 = 0;
  local_60 = 0xffffffffff;
  uStack_5b = 0xffffff;
  local_58 = 0xffffffff;
  local_54 = 0;
  local_50 = pProgress_data;
  vector<unsigned_int>::reserve(&local_70,uVar3);
  if ((this->m_training_vecs).m_size == 0) {
    fVar8 = 0.0;
  }
  else {
    fVar8 = 0.0;
    lVar15 = 0;
    uVar12 = 0;
    do {
      ppVar4 = (this->m_training_vecs).m_p;
      uVar13 = ppVar4[uVar12].second;
      fVar19 = (float)uVar13;
      lVar11 = 0;
      do {
        afStack_48[lVar11] = *(float *)((long)(ppVar4->first).m_s + lVar11 * 4 + lVar15) * fVar19;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 6);
      lVar11 = 0;
      do {
        local_98[lVar11] = afStack_48[lVar11] + local_98[lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 6);
      uStack_80 = uStack_80 + uVar13;
      if (local_70.m_capacity <= local_70.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_70,local_70.m_size + 1,true,4,(object_mover)0x0,false)
        ;
      }
      local_70.m_p[local_70.m_size] = (uint)uVar12;
      local_70.m_size = local_70.m_size + 1;
      fVar18 = ppVar4[uVar12].first.m_s[0];
      fVar18 = fVar18 * fVar18;
      lVar11 = 1;
      do {
        fVar2 = *(float *)((long)(ppVar4->first).m_s + lVar11 * 4 + lVar15);
        fVar18 = fVar18 + fVar2 * fVar2;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 6);
      fVar8 = fVar8 + fVar18 * fVar19;
      uVar12 = uVar12 + 1;
      lVar15 = lVar15 + 0x1c;
    } while (uVar12 < (this->m_training_vecs).m_size);
  }
  fVar19 = local_98[0] * local_98[0];
  lVar15 = 1;
  do {
    fVar19 = fVar19 + local_98[lVar15] * local_98[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 6);
  local_78 = fVar8 - fVar19 / (float)uStack_80;
  lVar15 = 0;
  do {
    local_98[lVar15] = local_98[lVar15] * (1.0 / (float)uStack_80);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 6);
  this_00 = &this->m_nodes;
  pvVar17 = (this->m_nodes).m_p;
  if (pvVar17 != (vq_node *)0x0) {
    uVar12 = (ulong)(this->m_nodes).m_size;
    if (uVar12 != 0) {
      lVar15 = 0;
      do {
        p = *(void **)((long)(&pvVar17->m_centroid + 1) + lVar15 + 0x10);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar15 = lVar15 + 0x48;
      } while (uVar12 * 0x48 != lVar15);
      pvVar17 = this_00->m_p;
    }
    crnlib_free(pvVar17);
    this_00->m_p = (vq_node *)0x0;
    (this->m_nodes).m_size = 0;
    (this->m_nodes).m_capacity = 0;
  }
  vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::reserve(this_00,max_size * 2 + 1);
  uVar13 = (this->m_nodes).m_size;
  if ((this->m_nodes).m_capacity <= uVar13) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,uVar13 + 1,true,0x48,
               vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::object_mover,false);
    uVar13 = (this->m_nodes).m_size;
  }
  pvVar17 = this_00->m_p;
  lVar15 = 0;
  do {
    pvVar17[uVar13].m_centroid.m_s[lVar15] = local_98[lVar15];
    lVar15 = lVar15 + 1;
  } while (lVar15 != 6);
  pvVar17[uVar13].m_variance = local_78;
  pvVar17[uVar13].m_total_weight = uStack_80;
  pvVar17[uVar13].m_vectors.m_p = (uint *)0x0;
  pvVar17[uVar13].m_vectors.m_size = 0;
  pvVar17[uVar13].m_vectors.m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&pvVar17[uVar13].m_vectors,local_70.m_size,false,4,
             (object_mover)0x0,false);
  pvVar17[uVar13].m_vectors.m_size = local_70.m_size;
  memcpy(pvVar17[uVar13].m_vectors.m_p,local_70.m_p,(local_70._8_8_ & 0xffffffff) << 2);
  pvVar17[uVar13].m_left = (int)local_60;
  pvVar17[uVar13].m_right = (int)(CONCAT35(uStack_5b,local_60) >> 0x20);
  *(ulong *)((long)&pvVar17[uVar13].m_right + 1) = CONCAT17(local_54,CONCAT43(local_58,uStack_5b));
  puVar1 = &(this->m_nodes).m_size;
  *puVar1 = *puVar1 + 1;
  this_01 = &this->m_heap;
  uVar13 = max_size + 1;
  uVar14 = (this->m_heap).m_size;
  if (uVar14 != uVar13) {
    if (uVar14 <= uVar13) {
      if ((this->m_heap).m_capacity < uVar13) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,uVar13,uVar14 == max_size,4,(object_mover)0x0,false);
        uVar14 = (this->m_heap).m_size;
      }
      memset(this_01->m_p + uVar14,0,(ulong)(uVar13 - uVar14) << 2);
    }
    (this->m_heap).m_size = uVar13;
  }
  (this->m_heap).m_p[1] = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  this_02 = &this->m_left_children;
  vector<unsigned_int>::reserve(this_02,(this->m_training_vecs).m_size + 1);
  this_03 = &this->m_right_children;
  vector<unsigned_int>::reserve(this_03,(this->m_training_vecs).m_size + 1);
  uVar14 = 1;
  uVar13 = 0xffffffff;
  do {
    if ((max_size <= uVar14) || (uVar10 = this->m_heap_size, uVar10 == 0)) {
LAB_0013a3c1:
      pvVar6 = (this->m_codebook).m_p;
      if (pvVar6 != (vec<6U,_float> *)0x0) {
        crnlib_free(pvVar6);
        (this->m_codebook).m_p = (vec<6U,_float> *)0x0;
        (this->m_codebook).m_size = 0;
        (this->m_codebook).m_capacity = 0;
      }
      this->m_overall_variance = 0.0;
      uVar13 = (this->m_nodes).m_size;
      if (uVar13 != 0) {
        lVar15 = 0x40;
        uVar12 = 0;
        do {
          pvVar17 = this_00->m_p;
          if (*(int *)((long)(pvVar17->m_centroid).m_s + lVar15 + -8) == -1) {
            uVar13 = (this->m_codebook).m_size;
            *(uint *)((long)(pvVar17->m_centroid).m_s + lVar15) = uVar13;
            if ((this->m_codebook).m_capacity <= uVar13) {
              elemental_vector::increase_capacity
                        ((elemental_vector *)&this->m_codebook,uVar13 + 1,true,0x18,
                         (object_mover)0x0,false);
              uVar13 = (this->m_codebook).m_size;
            }
            pvVar6 = (this->m_codebook).m_p;
            *(undefined8 *)(pvVar6[uVar13].m_s + 4) =
                 *(undefined8 *)((long)(&pvVar17->m_centroid + -2) + lVar15);
            uVar7 = *(undefined8 *)((long)(pvVar17->m_centroid).m_s + lVar15 + -0x38);
            pvVar6 = pvVar6 + uVar13;
            *(undefined8 *)pvVar6->m_s =
                 *(undefined8 *)((long)(pvVar17->m_centroid).m_s + lVar15 + -0x40);
            *(undefined8 *)(pvVar6->m_s + 2) = uVar7;
            puVar1 = &(this->m_codebook).m_size;
            *puVar1 = *puVar1 + 1;
            this->m_overall_variance =
                 *(float *)((long)(pvVar17->m_centroid).m_s + lVar15 + -0x20) +
                 this->m_overall_variance;
            uVar13 = (this->m_nodes).m_size;
          }
          uVar12 = uVar12 + 1;
          lVar15 = lVar15 + 0x48;
        } while (uVar12 < uVar13);
      }
      if (this_01->m_p != (uint *)0x0) {
        crnlib_free(this_01->m_p);
        this_01->m_p = (uint *)0x0;
        (this->m_heap).m_size = 0;
        (this->m_heap).m_capacity = 0;
      }
      if (this_02->m_p != (uint *)0x0) {
        crnlib_free(this_02->m_p);
        this_02->m_p = (uint *)0x0;
        (this->m_left_children).m_size = 0;
        (this->m_left_children).m_capacity = 0;
      }
      bVar9 = true;
      if (this_03->m_p != (uint *)0x0) {
        crnlib_free(this_03->m_p);
        this_03->m_p = (uint *)0x0;
        (this->m_right_children).m_size = 0;
        (this->m_right_children).m_capacity = 0;
      }
      goto LAB_0013a4cb;
    }
    uVar16 = uVar14 * 100 + (max_size >> 1) + 100;
    while( true ) {
      uVar14 = uVar14 + 1;
      puVar5 = (this->m_heap).m_p;
      uVar3 = puVar5[1];
      puVar5[1] = puVar5[uVar10];
      puVar1 = &this->m_heap_size;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 != 0) {
        down_heap(this,1);
      }
      split_node(this,uVar3);
      if (((uVar14 & 0x3f) == 0 && pProgress_callback != (progress_callback_func_ptr)0x0) &&
         (uVar10 = uVar16 / max_size, uVar10 != uVar13)) break;
      if (max_size <= uVar14) goto LAB_0013a3c1;
      uVar16 = uVar16 + 100;
      uVar10 = this->m_heap_size;
      if (uVar10 == 0) goto LAB_0013a3c1;
    }
    bVar9 = (*pProgress_callback)(uVar10,local_50);
    uVar13 = uVar10;
  } while (bVar9);
  bVar9 = false;
LAB_0013a4cb:
  if (local_70.m_p == (uint *)0x0) {
    return bVar9;
  }
  crnlib_free(local_70.m_p);
  return bVar9;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = nullptr, void* pProgress_data = nullptr, bool quick = false)
        {
            if (m_training_vecs.empty())
            {
                return false;
            }

            m_quick = quick;

            double ttsum = 0.0f;

            vq_node root;
            root.m_vectors.reserve(m_training_vecs.size());

            for (uint i = 0; i < m_training_vecs.size(); i++)
            {
                const VectorType& v = m_training_vecs[i].first;
                const uint weight = m_training_vecs[i].second;

                root.m_centroid += (v * (float)weight);
                root.m_total_weight += weight;
                root.m_vectors.push_back(i);

                ttsum += v.dot(v) * weight;
            }

            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

            root.m_centroid *= (1.0f / root.m_total_weight);

            m_nodes.clear();
            m_nodes.reserve(max_size * 2 + 1);

            m_nodes.push_back(root);

            m_heap.resize(max_size + 1);
            m_heap[1] = 0;
            m_heap_size = 1;

            m_split_index = 0;

            uint total_leaves = 1;

            m_left_children.reserve(m_training_vecs.size() + 1);
            m_right_children.reserve(m_training_vecs.size() + 1);

            int prev_percentage = -1;
            while ((total_leaves < max_size) && (m_heap_size))
            {
                int worst_node_index = m_heap[1];

                m_heap[1] = m_heap[m_heap_size];
                m_heap_size--;
                if (m_heap_size)
                {
                    down_heap(1);
                }

                split_node(worst_node_index);
                total_leaves++;

                if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size))
                {
                    int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
                    if (cur_percentage != prev_percentage)
                    {
                        if (!(*pProgress_callback)(cur_percentage, pProgress_data))
                        {
                            return false;
                        }

                        prev_percentage = cur_percentage;
                    }
                }
            }

            m_codebook.clear();

            m_overall_variance = 0.0f;

            for (uint i = 0; i < m_nodes.size(); i++)
            {
                vq_node& node = m_nodes[i];
                if (node.m_left != -1)
                {
                    CRNLIB_ASSERT(node.m_right != -1);
                    continue;
                }

                CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);

                m_overall_variance += node.m_variance;
            }

            m_heap.clear();
            m_left_children.clear();
            m_right_children.clear();

            return true;
        }